

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
unsubscribe_event_handlers
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          type_index *type_wrapper,agent_t *subscriber)

{
  agent_t *subscriber_local;
  type_index *type_wrapper_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  modify_and_remove_subscriber_if_needed<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::unsubscribe_event_handlers(std::type_index_const&,so_5::agent_t*)::_lambda(so_5::impl::local_mbox_details::subscriber_info_t&)_1_>
            (this,type_wrapper,subscriber);
  return;
}

Assistant:

virtual void
		unsubscribe_event_handlers(
			const std::type_index & type_wrapper,
			agent_t * subscriber ) override
			{
				modify_and_remove_subscriber_if_needed(
						type_wrapper,
						subscriber,
						[]( local_mbox_details::subscriber_info_t & info ) {
							info.drop_limit();
						} );
			}